

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool ExecuteWitnessScript
               (Span<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *stack_span,
               CScript *exec_script,uint flags,SigVersion sigversion,BaseSignatureChecker *checker,
               ScriptExecutionData *execdata,ScriptError *serror)

{
  long lVar1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *p_Var2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *p_Var3;
  bool bVar4;
  CScript *pCVar5;
  pointer pvVar6;
  uint uVar7;
  ScriptError SVar8;
  uint uVar9;
  pointer pvVar10;
  long in_FS_OFFSET;
  bool bVar11;
  opcodetype opcode;
  const_iterator pc;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
  ::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>const*,void>
            ((vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              *)&stack,stack_span->m_data,stack_span->m_data + stack_span->m_size,
             (allocator_type *)&pc);
  pvVar6 = stack.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar10 = stack.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (sigversion == TAPSCRIPT) {
    uVar7 = (exec_script->super_CScriptBase)._size;
    pCVar5 = (CScript *)(exec_script->super_CScriptBase)._union.indirect_contents.indirect;
    pc.ptr = (uchar *)pCVar5;
    if (uVar7 < 0x1d) {
      pc.ptr = (uchar *)exec_script;
    }
    while( true ) {
      uVar9 = uVar7 - 0x1d;
      if (uVar7 < 0x1d) {
        uVar9 = uVar7;
      }
      if (uVar7 < 0x1d) {
        pCVar5 = exec_script;
      }
      if ((pCVar5->super_CScriptBase)._union.direct + (int)uVar9 <= pc.ptr) {
        pvVar6 = stack.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar10 = stack.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((ulong)(((long)stack.
                           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)stack.
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18) < 0x3e9)
        goto LAB_001df8a9;
        if (serror != (ScriptError *)0x0) {
          *serror = SCRIPT_ERR_STACK_SIZE;
        }
        goto LAB_001df9d8;
      }
      bVar4 = CScript::GetOp(exec_script,&pc,&opcode);
      if (!bVar4) {
        bVar11 = false;
        if (serror == (ScriptError *)0x0) goto LAB_001df9da;
        SVar8 = SCRIPT_ERR_BAD_OPCODE;
        goto LAB_001df9b9;
      }
      bVar4 = IsOpSuccess(&opcode);
      if (bVar4) break;
      uVar7 = (exec_script->super_CScriptBase)._size;
      pCVar5 = (CScript *)(exec_script->super_CScriptBase)._union.indirect_contents.indirect;
    }
    bVar11 = (flags >> 0x13 & 1) == 0;
    if (serror != (ScriptError *)0x0) {
      SVar8 = (int)(flags << 0xc) >> 0x1f & SCRIPT_ERR_DISCOURAGE_OP_SUCCESS;
LAB_001df9b9:
      *serror = SVar8;
    }
  }
  else {
LAB_001df8a9:
    do {
      if (pvVar6 == pvVar10) {
        bVar4 = EvalScript(&stack,exec_script,flags,checker,sigversion,execdata,serror);
        if (!bVar4) goto LAB_001df9d8;
        if ((long)stack.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)stack.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x18) {
          bVar4 = CastToBool(stack.
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
          bVar11 = true;
          if (bVar4) goto LAB_001df9da;
          if (serror != (ScriptError *)0x0) {
            *serror = SCRIPT_ERR_EVAL_FALSE;
          }
        }
        else if (serror != (ScriptError *)0x0) {
          *serror = SCRIPT_ERR_CLEANSTACK;
        }
        goto LAB_001df9d8;
      }
      p_Var2 = &pvVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
      p_Var3 = &pvVar6->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
      pvVar6 = pvVar6 + 1;
    } while ((ulong)((long)(p_Var2->_M_impl).super__Vector_impl_data._M_finish -
                    (long)(p_Var3->_M_impl).super__Vector_impl_data._M_start) < 0x209);
    if (serror != (ScriptError *)0x0) {
      *serror = SCRIPT_ERR_PUSH_SIZE;
    }
LAB_001df9d8:
    bVar11 = false;
  }
LAB_001df9da:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&stack);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar11;
}

Assistant:

static bool ExecuteWitnessScript(const Span<const valtype>& stack_span, const CScript& exec_script, unsigned int flags, SigVersion sigversion, const BaseSignatureChecker& checker, ScriptExecutionData& execdata, ScriptError* serror)
{
    std::vector<valtype> stack{stack_span.begin(), stack_span.end()};

    if (sigversion == SigVersion::TAPSCRIPT) {
        // OP_SUCCESSx processing overrides everything, including stack element size limits
        CScript::const_iterator pc = exec_script.begin();
        while (pc < exec_script.end()) {
            opcodetype opcode;
            if (!exec_script.GetOp(pc, opcode)) {
                // Note how this condition would not be reached if an unknown OP_SUCCESSx was found
                return set_error(serror, SCRIPT_ERR_BAD_OPCODE);
            }
            // New opcodes will be listed here. May use a different sigversion to modify existing opcodes.
            if (IsOpSuccess(opcode)) {
                if (flags & SCRIPT_VERIFY_DISCOURAGE_OP_SUCCESS) {
                    return set_error(serror, SCRIPT_ERR_DISCOURAGE_OP_SUCCESS);
                }
                return set_success(serror);
            }
        }

        // Tapscript enforces initial stack size limits (altstack is empty here)
        if (stack.size() > MAX_STACK_SIZE) return set_error(serror, SCRIPT_ERR_STACK_SIZE);
    }

    // Disallow stack item size > MAX_SCRIPT_ELEMENT_SIZE in witness stack
    for (const valtype& elem : stack) {
        if (elem.size() > MAX_SCRIPT_ELEMENT_SIZE) return set_error(serror, SCRIPT_ERR_PUSH_SIZE);
    }

    // Run the script interpreter.
    if (!EvalScript(stack, exec_script, flags, checker, sigversion, execdata, serror)) return false;

    // Scripts inside witness implicitly require cleanstack behaviour
    if (stack.size() != 1) return set_error(serror, SCRIPT_ERR_CLEANSTACK);
    if (!CastToBool(stack.back())) return set_error(serror, SCRIPT_ERR_EVAL_FALSE);
    return true;
}